

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

bool __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:232:29)>_>
::included(Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:232:29)>_>
           *this,PathList *pathList,size_t depth)

{
  bool bVar1;
  __shared_ptr_access<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar2;
  size_type sVar3;
  reference __re;
  shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>
  *path;
  const_iterator __end4;
  const_iterator __begin4;
  PathList *__range4;
  size_t depth_local;
  PathList *pathList_local;
  Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:232:29)>_>
  *this_local;
  
  bVar1 = std::
          vector<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_>_>
          ::empty(pathList);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    __end4 = std::
             vector<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_>_>
             ::begin(pathList);
    path = (shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>
            *)std::
              vector<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_>_>
              ::end(pathList);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_*,_std::vector<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_>_>_>
                                       *)&path), bVar1) {
      this_00 = (__shared_ptr_access<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_*,_std::vector<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_>_>_>
                   ::operator*(&__end4);
      peVar2 = std::
               __shared_ptr_access<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      sVar3 = std::
              vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
              ::size(peVar2);
      if (sVar3 <= depth) {
        return true;
      }
      peVar2 = std::
               __shared_ptr_access<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(this_00);
      __re = std::
             vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
             ::operator[](peVar2,depth);
      bVar1 = ::std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (&this->name,__re,0);
      if (bVar1) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_*,_std::vector<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_>_>_>
      ::operator++(&__end4);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool included(const PathList& pathList, size_t depth) const {
            if (pathList.empty()) {
                return true;
            }

            for (const auto& path : pathList) {
                if (path->size() > depth) {
                    if (regex_match(name, (*path)[depth])) {
                        return true;
                    }
                }
                else {
                    return true;
                }
            }

            return false;
        }